

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O2

vector<User,_std::allocator<User>_> * getUsers(void)

{
  char cVar1;
  istream *piVar2;
  vector<User,_std::allocator<User>_> *in_RDI;
  istream local_298 [8];
  ifstream myfile;
  anon_struct_64_2_84df61a8 local_90;
  size_type *local_50;
  string line;
  
  local_50 = &line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  (in_RDI->super__Vector_base<User,_std::allocator<User>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (in_RDI->super__Vector_base<User,_std::allocator<User>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (in_RDI->super__Vector_base<User,_std::allocator<User>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(local_298,"../users.txt",_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_298,(string *)&local_50);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::string::find((char *)&local_50,0x109310);
      local_90.password.field_2._8_8_ = 0;
      local_90.password._M_string_length = 0;
      local_90.username.field_2._M_allocated_capacity = 0;
      local_90.username.field_2._8_8_ = 0;
      local_90.username._M_string_length = 0;
      local_90.password._M_dataplus._M_p = (pointer)&local_90.password.field_2;
      local_90.password.field_2._M_allocated_capacity = 0;
      local_90.username._M_dataplus._M_p = (pointer)&local_90.username.field_2;
      std::vector<User,_std::allocator<User>_>::emplace_back<User>(in_RDI,&local_90);
      anon_struct_64_2_84df61a8::~User(&local_90);
      std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_50);
      std::__cxx11::string::operator=
                ((string *)
                 ((in_RDI->super__Vector_base<User,_std::allocator<User>_>)._M_impl.
                  super__Vector_impl_data._M_finish + -1),(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_50);
      std::__cxx11::string::operator=
                ((string *)
                 &(in_RDI->super__Vector_base<User,_std::allocator<User>_>)._M_impl.
                  super__Vector_impl_data._M_finish[-1].password,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(local_298);
    std::__cxx11::string::~string((string *)&local_50);
    return in_RDI;
  }
  std::operator<<((ostream *)&std::cerr,"couldn\'t open file");
  exit(-1);
}

Assistant:

vector<User> getUsers(){
    string line;
    vector<User> users;
    ifstream myfile ("../users.txt");

    if(myfile.is_open()){
        while(getline(myfile,line)){

            //get pos of comma
            int commaPos = line.find(",");

            users.push_back(User());
            //username if everything before comma and after (
            users.back().username = line.substr(1,commaPos-1);
            //password is evertyhign after the comma and space and before the )
            users.back().password = line.substr(commaPos+2,line.length() - commaPos - 3);
        }
        myfile.close();
    }
    else{
        cerr << "couldn't open file";
        exit(-1);
    }


    return users;
}